

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::set_allocated_singlekdtreeindex
          (NearestNeighborsIndex *this,SingleKdTreeIndex *singlekdtreeindex)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  SingleKdTreeIndex *singlekdtreeindex_local;
  NearestNeighborsIndex *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_IndexType(this);
  if (singlekdtreeindex != (SingleKdTreeIndex *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<CoreML::Specification::SingleKdTreeIndex>::
         GetOwningArena(singlekdtreeindex);
    message_arena = (Arena *)singlekdtreeindex;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::SingleKdTreeIndex>
                              (message_arena_00,singlekdtreeindex,submessage_arena_00);
    }
    set_has_singlekdtreeindex(this);
    (this->IndexType_).linearindex_ = (LinearIndex *)message_arena;
  }
  return;
}

Assistant:

void NearestNeighborsIndex::set_allocated_singlekdtreeindex(::CoreML::Specification::SingleKdTreeIndex* singlekdtreeindex) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_IndexType();
  if (singlekdtreeindex) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::SingleKdTreeIndex>::GetOwningArena(singlekdtreeindex);
    if (message_arena != submessage_arena) {
      singlekdtreeindex = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, singlekdtreeindex, submessage_arena);
    }
    set_has_singlekdtreeindex();
    IndexType_.singlekdtreeindex_ = singlekdtreeindex;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.NearestNeighborsIndex.singleKdTreeIndex)
}